

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

long __thiscall
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<duckdb::uhugeint_t,long>
          (VectorTryCastOperator<duckdb::NumericTryCast> *this,uhugeint_t input,ValidityMask *mask,
          idx_t idx,void *dataptr)

{
  bool bVar1;
  long lVar2;
  ValidityMask *pVVar3;
  PhysicalType type;
  PhysicalType type_00;
  uhugeint_t input_00;
  uhugeint_t input_01;
  long output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  input_01.lower = input.lower;
  input_01.upper = (uint64_t)&output;
  pVVar3 = mask;
  bVar1 = Uhugeint::TryCast<long>((Uhugeint *)this,input_01,(int64_t *)mask);
  if (!bVar1) {
    TypeIdToString_abi_cxx11_(&local_50,(duckdb *)0xcb,type);
    ::std::operator+(&local_d0,"Type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50)
    ;
    ::std::operator+(&local_b0,&local_d0," with value ");
    input_00.upper = (uint64_t)pVVar3;
    input_00.lower = input_01.lower;
    ConvertToString::Operation<duckdb::uhugeint_t>(&local_f0,(ConvertToString *)this,input_00);
    ::std::operator+(&local_90,&local_b0,&local_f0);
    ::std::operator+(&local_70,&local_90,
                     " can\'t be cast because the value is out of range for the destination type ");
    TypeIdToString_abi_cxx11_(&local_110,(duckdb *)0x9,type_00);
    ::std::operator+(&local_130,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110
                    );
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_50);
    lVar2 = HandleVectorCastError::Operation<long>
                      (&local_130,(ValidityMask *)input.upper,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_130);
    output = lVar2;
  }
  return output;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}